

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O0

void __thiscall helics::SmallBuffer::SmallBuffer(SmallBuffer *this)

{
  pointer pvVar1;
  undefined1 *in_RDI;
  
  memset(in_RDI,0,0x40);
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0x40;
  pvVar1 = std::array<std::byte,_64UL>::data((array<std::byte,_64UL> *)0x30772c);
  *(pointer *)(in_RDI + 0x50) = pvVar1;
  in_RDI[0x58] = 0;
  in_RDI[0x59] = 0;
  in_RDI[0x5a] = 0;
  in_RDI[0x5b] = 0;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  return;
}

Assistant:

SmallBuffer() noexcept: heap(buffer.data()) {}